

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_16777232,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  int iVar24;
  Geometry *pGVar25;
  long lVar26;
  RTCIntersectArguments *pRVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined1 (*pauVar36) [16];
  undefined8 uVar37;
  int iVar38;
  undefined4 uVar39;
  float *vertices;
  undefined1 (*pauVar40) [16];
  long lVar41;
  RayQueryContext *pRVar43;
  AABBNodeMB4D *node1;
  ulong uVar44;
  RTCRayQueryContext *pRVar45;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  float fVar57;
  float fVar58;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  float fVar67;
  float fVar71;
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar87;
  float fVar88;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar89;
  float fVar90;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar91;
  float fVar100;
  float fVar101;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar110;
  float fVar114;
  float fVar115;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  undefined1 local_11cc [4];
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [16];
  RayQueryContext *local_11a0;
  Scene *local_1198;
  long local_1190;
  RTCFilterFunctionNArguments local_1188;
  ulong local_1158;
  long local_1150;
  ulong local_1148;
  ulong local_1140;
  ulong local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  float local_1118;
  undefined4 local_1114;
  float local_1110;
  undefined4 local_110c;
  float local_1108;
  undefined4 local_1104;
  uint local_1100;
  uint local_10fc;
  uint local_10f8;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068 [4];
  float local_1058 [4];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  float local_1028 [4];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  uint local_fa8;
  uint uStack_fa4;
  uint uStack_fa0;
  uint uStack_f9c;
  undefined8 local_f98;
  float fStack_f90;
  float fStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar42;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_11a0 = context;
    pauVar40 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar66 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar57 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar80 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar117 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar126 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar133 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar58 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar79 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar63 = 0.0;
    if (0.0 <= fVar117) {
      fVar63 = fVar117;
    }
    fVar117 = (ray->super_RayK<1>).tfar;
    fVar87 = 0.0;
    if (0.0 <= fVar117) {
      fVar87 = fVar117;
    }
    uVar53 = -(uint)((float)DAT_01f80d30 <= ABS(fVar126));
    uVar54 = -(uint)(DAT_01f80d30._4_4_ <= ABS(fVar133));
    uVar55 = -(uint)(DAT_01f80d30._8_4_ <= ABS(fVar58));
    uVar56 = -(uint)(DAT_01f80d30._12_4_ <= ABS(fVar79));
    auVar82._0_4_ = (uint)fVar126 & uVar53;
    auVar82._4_4_ = (uint)fVar133 & uVar54;
    auVar82._8_4_ = (uint)fVar58 & uVar55;
    auVar82._12_4_ = (uint)fVar79 & uVar56;
    auVar92._0_4_ = ~uVar53 & (uint)(float)DAT_01f80d30;
    auVar92._4_4_ = ~uVar54 & (uint)DAT_01f80d30._4_4_;
    auVar92._8_4_ = ~uVar55 & (uint)DAT_01f80d30._8_4_;
    auVar92._12_4_ = ~uVar56 & (uint)DAT_01f80d30._12_4_;
    auVar92 = auVar92 | auVar82;
    auVar81 = rcpps(auVar82,auVar92);
    fVar140 = auVar81._0_4_;
    fVar143 = auVar81._4_4_;
    fVar146 = auVar81._8_4_;
    fVar140 = (1.0 - auVar92._0_4_ * fVar140) * fVar140 + fVar140;
    fVar143 = (1.0 - auVar92._4_4_ * fVar143) * fVar143 + fVar143;
    fVar146 = (1.0 - auVar92._8_4_ * fVar146) * fVar146 + fVar146;
    uVar42 = (ulong)(fVar140 < 0.0) << 4;
    uVar48 = (ulong)(fVar143 < 0.0) << 4 | 0x20;
    uVar52 = (ulong)(fVar146 < 0.0) << 4 | 0x40;
    uVar51 = uVar42 ^ 0x10;
    auVar81._4_4_ = fVar87;
    auVar81._0_4_ = fVar87;
    auVar81._8_4_ = fVar87;
    auVar81._12_4_ = fVar87;
    _local_fa8 = mm_lookupmask_ps._240_8_;
    _uStack_fa0 = mm_lookupmask_ps._248_8_;
    local_fb8 = fVar80;
    fStack_fb4 = fVar80;
    fStack_fb0 = fVar80;
    fStack_fac = fVar80;
    local_fc8 = fVar63;
    fStack_fc4 = fVar63;
    fStack_fc0 = fVar63;
    fStack_fbc = fVar63;
    local_fd8 = fVar146;
    fStack_fd4 = fVar146;
    fStack_fd0 = fVar146;
    fStack_fcc = fVar146;
    local_fe8 = fVar66;
    fStack_fe4 = fVar66;
    fStack_fe0 = fVar66;
    fStack_fdc = fVar66;
    local_ff8 = fVar57;
    fStack_ff4 = fVar57;
    fStack_ff0 = fVar57;
    fStack_fec = fVar57;
    local_1158 = uVar42;
    local_1008 = fVar140;
    fStack_1004 = fVar140;
    fStack_1000 = fVar140;
    fStack_ffc = fVar140;
    local_1018 = fVar143;
    fStack_1014 = fVar143;
    fStack_1010 = fVar143;
    fStack_100c = fVar143;
    fVar109 = fVar143;
    fVar108 = fVar143;
    fVar102 = fVar143;
    fVar101 = fVar140;
    fVar100 = fVar140;
    fVar91 = fVar140;
    fVar90 = fVar57;
    fVar89 = fVar57;
    fVar88 = fVar57;
    fVar74 = fVar66;
    fVar73 = fVar66;
    fVar72 = fVar66;
    fVar71 = fVar146;
    fVar67 = fVar146;
    fVar65 = fVar146;
    fVar64 = fVar63;
    fVar87 = fVar63;
    fVar79 = fVar63;
    fVar58 = fVar80;
    fVar133 = fVar80;
    fVar126 = fVar80;
LAB_00d076f9:
    do {
      pauVar36 = pauVar40 + -1;
      pauVar40 = pauVar40 + -1;
      if (*(float *)((long)*pauVar36 + 8) <= fVar117) {
        uVar46 = *(ulong *)*pauVar40;
        while ((uVar46 & 8) == 0) {
          fVar110 = (ray->super_RayK<1>).dir.field_0.m128[3];
          fVar117 = (ray->super_RayK<1>).tfar;
          uVar44 = uVar46 & 0xfffffffffffffff0;
          pfVar23 = (float *)(uVar44 + 0x80 + uVar42);
          pfVar22 = (float *)(uVar44 + 0x20 + uVar42);
          auVar106._0_4_ = ((*pfVar23 * fVar110 + *pfVar22) - fVar72) * fVar91;
          auVar106._4_4_ = ((pfVar23[1] * fVar110 + pfVar22[1]) - fVar73) * fVar100;
          auVar106._8_4_ = ((pfVar23[2] * fVar110 + pfVar22[2]) - fVar74) * fVar101;
          auVar106._12_4_ = ((pfVar23[3] * fVar110 + pfVar22[3]) - fVar66) * fVar140;
          auVar97._4_4_ = fVar87;
          auVar97._0_4_ = fVar79;
          auVar97._8_4_ = fVar64;
          auVar97._12_4_ = fVar63;
          auVar82 = maxps(auVar97,auVar106);
          pfVar23 = (float *)(uVar44 + 0x80 + uVar48);
          pfVar22 = (float *)(uVar44 + 0x20 + uVar48);
          auVar113._0_4_ = ((*pfVar23 * fVar110 + *pfVar22) - fVar88) * fVar102;
          auVar113._4_4_ = ((pfVar23[1] * fVar110 + pfVar22[1]) - fVar89) * fVar108;
          auVar113._8_4_ = ((pfVar23[2] * fVar110 + pfVar22[2]) - fVar90) * fVar109;
          auVar113._12_4_ = ((pfVar23[3] * fVar110 + pfVar22[3]) - fVar57) * fVar143;
          pfVar23 = (float *)(uVar44 + 0x80 + uVar52);
          pfVar22 = (float *)(uVar44 + 0x20 + uVar52);
          auVar103._0_4_ = ((*pfVar23 * fVar110 + *pfVar22) - fVar126) * fVar65;
          auVar103._4_4_ = ((pfVar23[1] * fVar110 + pfVar22[1]) - fVar133) * fVar67;
          auVar103._8_4_ = ((pfVar23[2] * fVar110 + pfVar22[2]) - fVar58) * fVar71;
          auVar103._12_4_ = ((pfVar23[3] * fVar110 + pfVar22[3]) - fVar80) * fVar146;
          auVar92 = maxps(auVar113,auVar103);
          local_10d8 = maxps(auVar82,auVar92);
          pfVar23 = (float *)(uVar44 + 0x80 + uVar51);
          pfVar22 = (float *)(uVar44 + 0x20 + uVar51);
          auVar104._0_4_ = ((*pfVar23 * fVar110 + *pfVar22) - fVar72) * fVar91;
          auVar104._4_4_ = ((pfVar23[1] * fVar110 + pfVar22[1]) - fVar73) * fVar100;
          auVar104._8_4_ = ((pfVar23[2] * fVar110 + pfVar22[2]) - fVar74) * fVar101;
          auVar104._12_4_ = ((pfVar23[3] * fVar110 + pfVar22[3]) - fVar66) * fVar140;
          pfVar23 = (float *)(uVar44 + 0x80 + (uVar48 ^ 0x10));
          pfVar22 = (float *)(uVar44 + 0x20 + (uVar48 ^ 0x10));
          auVar111._0_4_ = ((*pfVar23 * fVar110 + *pfVar22) - fVar88) * fVar102;
          auVar111._4_4_ = ((pfVar23[1] * fVar110 + pfVar22[1]) - fVar89) * fVar108;
          auVar111._8_4_ = ((pfVar23[2] * fVar110 + pfVar22[2]) - fVar90) * fVar109;
          auVar111._12_4_ = ((pfVar23[3] * fVar110 + pfVar22[3]) - fVar57) * fVar143;
          pfVar23 = (float *)(uVar44 + 0x80 + (uVar52 ^ 0x10));
          pfVar22 = (float *)(uVar44 + 0x20 + (uVar52 ^ 0x10));
          auVar93._0_4_ = ((*pfVar23 * fVar110 + *pfVar22) - fVar126) * fVar65;
          auVar93._4_4_ = ((pfVar23[1] * fVar110 + pfVar22[1]) - fVar133) * fVar67;
          auVar93._8_4_ = ((pfVar23[2] * fVar110 + pfVar22[2]) - fVar58) * fVar71;
          auVar93._12_4_ = ((pfVar23[3] * fVar110 + pfVar22[3]) - fVar80) * fVar146;
          auVar92 = minps(auVar111,auVar93);
          auVar82 = minps(auVar81,auVar104);
          auVar82 = minps(auVar82,auVar92);
          if (((uint)uVar46 & 7) == 6) {
            bVar28 = (fVar110 < *(float *)(uVar44 + 0xf0) && *(float *)(uVar44 + 0xe0) <= fVar110)
                     && local_10d8._0_4_ <= auVar82._0_4_;
            bVar29 = (fVar110 < *(float *)(uVar44 + 0xf4) && *(float *)(uVar44 + 0xe4) <= fVar110)
                     && local_10d8._4_4_ <= auVar82._4_4_;
            bVar30 = (fVar110 < *(float *)(uVar44 + 0xf8) && *(float *)(uVar44 + 0xe8) <= fVar110)
                     && local_10d8._8_4_ <= auVar82._8_4_;
            bVar31 = (fVar110 < *(float *)(uVar44 + 0xfc) && *(float *)(uVar44 + 0xec) <= fVar110)
                     && local_10d8._12_4_ <= auVar82._12_4_;
          }
          else {
            bVar28 = local_10d8._0_4_ <= auVar82._0_4_;
            bVar29 = local_10d8._4_4_ <= auVar82._4_4_;
            bVar30 = local_10d8._8_4_ <= auVar82._8_4_;
            bVar31 = local_10d8._12_4_ <= auVar82._12_4_;
          }
          auVar75._0_4_ = (uint)bVar28 * -0x80000000;
          auVar75._4_4_ = (uint)bVar29 * -0x80000000;
          auVar75._8_4_ = (uint)bVar30 * -0x80000000;
          auVar75._12_4_ = (uint)bVar31 * -0x80000000;
          uVar53 = movmskps((int)context,auVar75);
          context = (RayQueryContext *)(ulong)uVar53;
          if (uVar53 == 0) {
            if (pauVar40 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d076f9;
          }
          context = (RayQueryContext *)0x0;
          if ((byte)uVar53 != 0) {
            for (; ((byte)uVar53 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar46 = *(ulong *)(uVar44 + (long)context * 8);
          uVar53 = (uVar53 & 0xff) - 1 & uVar53 & 0xff;
          if (uVar53 != 0) {
            uVar54 = *(uint *)(local_10d8 + (long)context * 4);
            lVar41 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
              }
            }
            uVar47 = *(ulong *)(uVar44 + lVar41 * 8);
            uVar55 = *(uint *)(local_10d8 + lVar41 * 4);
            uVar53 = uVar53 - 1 & uVar53;
            context = (RayQueryContext *)(ulong)uVar53;
            if (uVar53 == 0) {
              if (uVar54 < uVar55) {
                *(ulong *)*pauVar40 = uVar47;
                *(uint *)((long)*pauVar40 + 8) = uVar55;
                pauVar40 = pauVar40 + 1;
              }
              else {
                *(ulong *)*pauVar40 = uVar46;
                *(uint *)((long)*pauVar40 + 8) = uVar54;
                pauVar40 = pauVar40 + 1;
                uVar46 = uVar47;
              }
            }
            else {
              auVar68._8_4_ = uVar54;
              auVar68._0_8_ = uVar46;
              auVar68._12_4_ = 0;
              auVar76._8_4_ = uVar55;
              auVar76._0_8_ = uVar47;
              auVar76._12_4_ = 0;
              lVar41 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar53 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              uVar46 = *(ulong *)(uVar44 + lVar41 * 8);
              iVar38 = *(int *)(local_10d8 + lVar41 * 4);
              auVar83._8_4_ = iVar38;
              auVar83._0_8_ = uVar46;
              auVar83._12_4_ = 0;
              auVar94._8_4_ = -(uint)((int)uVar54 < (int)uVar55);
              uVar53 = uVar53 - 1 & uVar53;
              if (uVar53 == 0) {
                auVar94._4_4_ = auVar94._8_4_;
                auVar94._0_4_ = auVar94._8_4_;
                auVar94._12_4_ = auVar94._8_4_;
                auVar82 = auVar68 & auVar94 | ~auVar94 & auVar76;
                auVar92 = auVar76 & auVar94 | ~auVar94 & auVar68;
                auVar95._8_4_ = -(uint)(auVar82._8_4_ < iVar38);
                auVar95._0_8_ = CONCAT44(auVar95._8_4_,auVar95._8_4_);
                auVar95._12_4_ = auVar95._8_4_;
                uVar46 = ~auVar95._0_8_ & uVar46 | auVar82._0_8_ & auVar95._0_8_;
                auVar82 = auVar83 & auVar95 | ~auVar95 & auVar82;
                auVar69._8_4_ = -(uint)(auVar92._8_4_ < auVar82._8_4_);
                auVar69._4_4_ = auVar69._8_4_;
                auVar69._0_4_ = auVar69._8_4_;
                auVar69._12_4_ = auVar69._8_4_;
                *pauVar40 = ~auVar69 & auVar92 | auVar82 & auVar69;
                pauVar40[1] = auVar92 & auVar69 | ~auVar69 & auVar82;
                pauVar40 = pauVar40 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                iVar24 = *(int *)(local_10d8 + (long)context * 4);
                auVar105._8_4_ = iVar24;
                auVar105._0_8_ = *(undefined8 *)(uVar44 + (long)context * 8);
                auVar105._12_4_ = 0;
                auVar96._4_4_ = auVar94._8_4_;
                auVar96._0_4_ = auVar94._8_4_;
                auVar96._8_4_ = auVar94._8_4_;
                auVar96._12_4_ = auVar94._8_4_;
                auVar82 = auVar68 & auVar96 | ~auVar96 & auVar76;
                auVar92 = auVar76 & auVar96 | ~auVar96 & auVar68;
                auVar112._0_4_ = -(uint)(iVar38 < iVar24);
                auVar112._4_4_ = -(uint)(iVar38 < iVar24);
                auVar112._8_4_ = -(uint)(iVar38 < iVar24);
                auVar112._12_4_ = -(uint)(iVar38 < iVar24);
                auVar97 = auVar83 & auVar112 | ~auVar112 & auVar105;
                auVar113 = ~auVar112 & auVar83 | auVar105 & auVar112;
                auVar84._8_4_ = -(uint)(auVar92._8_4_ < auVar113._8_4_);
                auVar84._4_4_ = auVar84._8_4_;
                auVar84._0_4_ = auVar84._8_4_;
                auVar84._12_4_ = auVar84._8_4_;
                auVar106 = auVar92 & auVar84 | ~auVar84 & auVar113;
                auVar77._8_4_ = -(uint)(auVar82._8_4_ < auVar97._8_4_);
                auVar77._0_8_ = CONCAT44(auVar77._8_4_,auVar77._8_4_);
                auVar77._12_4_ = auVar77._8_4_;
                uVar46 = auVar82._0_8_ & auVar77._0_8_ | ~auVar77._0_8_ & auVar97._0_8_;
                auVar82 = ~auVar77 & auVar82 | auVar97 & auVar77;
                auVar70._8_4_ = -(uint)(auVar82._8_4_ < auVar106._8_4_);
                auVar70._4_4_ = auVar70._8_4_;
                auVar70._0_4_ = auVar70._8_4_;
                auVar70._12_4_ = auVar70._8_4_;
                *pauVar40 = ~auVar84 & auVar92 | auVar113 & auVar84;
                pauVar40[1] = ~auVar70 & auVar82 | auVar106 & auVar70;
                pauVar40[2] = auVar82 & auVar70 | ~auVar70 & auVar106;
                pauVar40 = pauVar40 + 3;
              }
            }
          }
        }
        local_1150 = (ulong)((uint)uVar46 & 0xf) - 8;
        if (local_1150 != 0) {
          uVar46 = uVar46 & 0xfffffffffffffff0;
          local_1198 = local_11a0->scene;
          local_1190 = 0;
          do {
            lVar41 = local_1190 * 0x50;
            pGVar25 = (local_1198->geometries).items[*(uint *)(uVar46 + 0x30 + lVar41)].ptr;
            fVar66 = pGVar25->fnumTimeSegments;
            fVar57 = (pGVar25->time_range).lower;
            fVar57 = floorf((((ray->super_RayK<1>).dir.field_0.m128[3] - fVar57) /
                            ((pGVar25->time_range).upper - fVar57)) * fVar66);
            fVar66 = fVar66 + -1.0;
            if (fVar66 <= fVar57) {
              fVar57 = fVar66;
            }
            fVar66 = 0.0;
            if (0.0 <= fVar57) {
              fVar66 = fVar57;
            }
            uVar50 = (ulong)*(uint *)(uVar46 + 4 + lVar41);
            lVar26 = *(long *)(*(long *)&pGVar25[2].numPrimitives + (long)(int)fVar66 * 0x38);
            context = *(RayQueryContext **)
                       (*(long *)&pGVar25[2].numPrimitives + 0x38 + (long)(int)fVar66 * 0x38);
            pfVar22 = (float *)(lVar26 + (ulong)*(uint *)(uVar46 + lVar41) * 4);
            uVar42 = (ulong)*(uint *)(uVar46 + 0x10 + lVar41);
            puVar1 = (undefined8 *)(lVar26 + uVar42 * 4);
            uVar33 = *puVar1;
            _fStack_11c0 = puVar1[1];
            uVar37 = _fStack_11c0;
            local_1120 = (ulong)*(uint *)(uVar46 + 0x20 + lVar41);
            puVar1 = (undefined8 *)(lVar26 + local_1120 * 4);
            uVar34 = *puVar1;
            uVar35 = puVar1[1];
            pfVar23 = (float *)(lVar26 + uVar50 * 4);
            local_1138 = (ulong)*(uint *)(uVar46 + 0x14 + lVar41);
            pfVar2 = (float *)(lVar26 + local_1138 * 4);
            local_1128 = (ulong)*(uint *)(uVar46 + 0x24 + lVar41);
            pfVar3 = (float *)(lVar26 + local_1128 * 4);
            uVar44 = (ulong)*(uint *)(uVar46 + 8 + lVar41);
            pfVar4 = (float *)(lVar26 + uVar44 * 4);
            fVar66 = pfVar4[2];
            local_1148 = (ulong)*(uint *)(uVar46 + 0x18 + lVar41);
            lVar5 = lVar26 + local_1148 * 4;
            local_1130 = (ulong)*(uint *)(uVar46 + 0x28 + lVar41);
            pfVar6 = (float *)(lVar26 + local_1130 * 4);
            uVar47 = (ulong)*(uint *)(uVar46 + 0xc + lVar41);
            pfVar7 = (float *)(lVar26 + uVar47 * 4);
            local_1140 = (ulong)*(uint *)(uVar46 + 0x1c + lVar41);
            lVar8 = lVar26 + local_1140 * 4;
            uVar49 = (ulong)*(uint *)(uVar46 + 0x2c + lVar41);
            pfVar9 = (float *)(lVar26 + uVar49 * 4);
            pfVar10 = (float *)((long)&context->scene + (ulong)*(uint *)(uVar46 + lVar41) * 4);
            pfVar11 = (float *)((long)&context->scene + uVar42 * 4);
            pfVar12 = (float *)((long)&context->scene + uVar50 * 4);
            local_11c8._0_4_ = (float)uVar33;
            fVar57 = (float)local_11c8;
            local_11c8._4_4_ = (float)((ulong)uVar33 >> 0x20);
            fVar80 = local_11c8._4_4_;
            pfVar13 = (float *)((long)&context->scene + uVar44 * 4);
            local_11c8 = (RayQueryContext *)CONCAT44(pfVar2[2],fStack_11c0);
            local_11b8._4_4_ = *(undefined4 *)(lVar8 + 8);
            local_11b8._0_4_ = *(undefined4 *)(lVar5 + 8);
            local_f98 = CONCAT44(*pfVar2,fVar57);
            local_1218 = (float)uVar34;
            fStack_1214 = (float)((ulong)uVar34 >> 0x20);
            fStack_1210 = (float)uVar35;
            pfVar14 = (float *)((long)&context->scene + uVar47 * 4);
            pfVar15 = (float *)((long)&context->scene + local_1148 * 4);
            pfVar16 = (float *)((long)&context->scene + local_1138 * 4);
            pfVar17 = (float *)((long)&context->scene + local_1140 * 4);
            pfVar18 = (float *)((long)&context->scene + local_1120 * 4);
            pfVar19 = (float *)((long)&context->scene + local_1130 * 4);
            pfVar20 = (float *)((long)&context->scene + local_1128 * 4);
            pfVar21 = (float *)((long)&context->scene + uVar49 * 4);
            fVar117 = 1.0 - fVar66;
            fVar67 = *pfVar22 * fVar117 + *pfVar10 * fVar66;
            fVar71 = *pfVar23 * fVar117 + *pfVar12 * fVar66;
            fVar146 = *pfVar4 * fVar117 + *pfVar13 * fVar66;
            fVar73 = *pfVar7 * fVar117 + *pfVar14 * fVar66;
            fVar131 = pfVar22[1] * fVar117 + pfVar10[1] * fVar66;
            fVar134 = pfVar23[1] * fVar117 + pfVar12[1] * fVar66;
            fVar136 = pfVar4[1] * fVar117 + pfVar13[1] * fVar66;
            fVar138 = pfVar7[1] * fVar117 + pfVar14[1] * fVar66;
            fVar79 = pfVar6[2] * fVar117 + pfVar10[2] * fVar66;
            fVar87 = pfVar9[2] * fVar117 + pfVar12[2] * fVar66;
            fVar88 = fStack_1200 * fVar117 + pfVar13[2] * fVar66;
            fVar89 = fStack_11fc * fVar117 + pfVar14[2] * fVar66;
            fStack_120c = (float)((ulong)uVar35 >> 0x20);
            puVar1 = (undefined8 *)(uVar46 + 0x30 + lVar41);
            local_f88 = *puVar1;
            uStack_f80 = puVar1[1];
            puVar1 = (undefined8 *)(uVar46 + 0x40 + lVar41);
            local_10e8 = *puVar1;
            uStack_10e0 = puVar1[1];
            fVar58 = fVar67 - (fVar57 * fVar117 + *pfVar11 * fVar66);
            fVar63 = fVar71 - (*pfVar2 * fVar117 + *pfVar16 * fVar66);
            fVar64 = fVar146 - (fStack_f90 * fVar117 + *pfVar15 * fVar66);
            fVar65 = fVar73 - (fStack_f8c * fVar117 + *pfVar17 * fVar66);
            fVar127 = fVar131 - (fVar80 * fVar117 + pfVar11[1] * fVar66);
            fVar128 = fVar134 - (pfVar2[1] * fVar117 + pfVar16[1] * fVar66);
            fVar129 = fVar136 - (*(float *)(lVar5 + 4) * fVar117 + pfVar15[1] * fVar66);
            fVar130 = fVar138 - (*(float *)(lVar8 + 4) * fVar117 + pfVar17[1] * fVar66);
            fVar141 = fVar79 - (fStack_11c0 * fVar117 + pfVar11[2] * fVar66);
            fVar144 = fVar87 - (pfVar2[2] * fVar117 + pfVar16[2] * fVar66);
            fVar147 = fVar88 - (fStack_11c0 * fVar117 + pfVar15[2] * fVar66);
            fVar149 = fVar89 - (fStack_11bc * fVar117 + pfVar17[2] * fVar66);
            fVar102 = (local_1218 * fVar117 + *pfVar18 * fVar66) - fVar67;
            fVar108 = (*pfVar3 * fVar117 + *pfVar20 * fVar66) - fVar71;
            fVar109 = (*pfVar6 * fVar117 + *pfVar19 * fVar66) - fVar146;
            fVar143 = (*pfVar9 * fVar117 + *pfVar21 * fVar66) - fVar73;
            fVar91 = (fStack_1214 * fVar117 + pfVar18[1] * fVar66) - fVar131;
            fVar100 = (pfVar3[1] * fVar117 + pfVar20[1] * fVar66) - fVar134;
            fVar101 = (pfVar6[1] * fVar117 + pfVar19[1] * fVar66) - fVar136;
            fVar140 = (pfVar9[1] * fVar117 + pfVar21[1] * fVar66) - fVar138;
            fVar118 = (fVar117 * fStack_1210 + fVar66 * pfVar18[2]) - fVar79;
            fVar119 = (fVar117 * pfVar3[2] + fVar66 * pfVar20[2]) - fVar87;
            fVar120 = (fVar117 * fStack_1210 + fVar66 * pfVar19[2]) - fVar88;
            fVar121 = (fVar117 * fStack_120c + fVar66 * pfVar21[2]) - fVar89;
            fVar110 = fVar141 * fVar91 - fVar127 * fVar118;
            fVar114 = fVar144 * fVar100 - fVar128 * fVar119;
            auVar32._4_4_ = fVar114;
            auVar32._0_4_ = fVar110;
            fVar115 = fVar147 * fVar101 - fVar129 * fVar120;
            fVar116 = fVar149 * fVar140 - fVar130 * fVar121;
            fVar66 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar57 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar80 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar117 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar126 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar133 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar67 = fVar67 - fVar66;
            fVar71 = fVar71 - fVar66;
            fVar146 = fVar146 - fVar66;
            fVar73 = fVar73 - fVar66;
            fVar131 = fVar131 - fVar57;
            fVar134 = fVar134 - fVar57;
            fVar136 = fVar136 - fVar57;
            fVar138 = fVar138 - fVar57;
            fVar151 = fVar67 * fVar126 - fVar131 * fVar117;
            fVar152 = fVar71 * fVar126 - fVar134 * fVar117;
            fVar153 = fVar146 * fVar126 - fVar136 * fVar117;
            fVar154 = fVar73 * fVar126 - fVar138 * fVar117;
            fVar66 = fVar58 * fVar118 - fVar141 * fVar102;
            fVar57 = fVar63 * fVar119 - fVar144 * fVar108;
            auVar59._4_4_ = fVar57;
            auVar59._0_4_ = fVar66;
            fVar72 = fVar64 * fVar120 - fVar147 * fVar109;
            fVar74 = fVar65 * fVar121 - fVar149 * fVar143;
            fVar79 = fVar79 - fVar80;
            fVar87 = fVar87 - fVar80;
            fStack_1200 = fVar88 - fVar80;
            fStack_11fc = fVar89 - fVar80;
            fVar80 = fVar79 * fVar117 - fVar67 * fVar133;
            fVar88 = fVar87 * fVar117 - fVar71 * fVar133;
            fVar89 = fStack_1200 * fVar117 - fVar146 * fVar133;
            fVar90 = fStack_11fc * fVar117 - fVar73 * fVar133;
            fVar142 = fVar127 * fVar102 - fVar58 * fVar91;
            fVar145 = fVar128 * fVar108 - fVar63 * fVar100;
            fVar148 = fVar129 * fVar109 - fVar64 * fVar101;
            fVar150 = fVar130 * fVar143 - fVar65 * fVar140;
            fVar132 = fVar131 * fVar133 - fVar79 * fVar126;
            fVar135 = fVar134 * fVar133 - fVar87 * fVar126;
            fVar137 = fVar136 * fVar133 - fStack_1200 * fVar126;
            fVar139 = fVar138 * fVar133 - fStack_11fc * fVar126;
            auVar59._8_4_ = fVar72;
            auVar59._12_4_ = fVar74;
            fVar122 = fVar117 * fVar110 + fVar126 * fVar66 + fVar133 * fVar142;
            fVar124 = fVar117 * fVar114 + fVar126 * fVar57 + fVar133 * fVar145;
            fVar125 = fVar117 * fVar115 + fVar126 * fVar72 + fVar133 * fVar148;
            fVar126 = fVar117 * fVar116 + fVar126 * fVar74 + fVar133 * fVar150;
            uVar53 = (uint)fVar122 & 0x80000000;
            uVar54 = (uint)fVar124 & 0x80000000;
            uVar55 = (uint)fVar125 & 0x80000000;
            uVar56 = (uint)fVar126 & 0x80000000;
            auVar107._0_4_ =
                 (float)((uint)(fVar102 * fVar132 + fVar91 * fVar80 + fVar118 * fVar151) ^ uVar53);
            auVar107._4_4_ =
                 (float)((uint)(fVar108 * fVar135 + fVar100 * fVar88 + fVar119 * fVar152) ^ uVar54);
            auVar107._8_4_ =
                 (float)((uint)(fVar109 * fVar137 + fVar101 * fVar89 + fVar120 * fVar153) ^ uVar55);
            auVar107._12_4_ =
                 (float)((uint)(fVar143 * fVar139 + fVar140 * fVar90 + fVar121 * fVar154) ^ uVar56);
            fVar133 = (float)((uint)(fVar132 * fVar58 + fVar80 * fVar127 + fVar151 * fVar141) ^
                             uVar53);
            fVar58 = (float)((uint)(fVar135 * fVar63 + fVar88 * fVar128 + fVar152 * fVar144) ^
                            uVar54);
            fVar63 = (float)((uint)(fVar137 * fVar64 + fVar89 * fVar129 + fVar153 * fVar147) ^
                            uVar55);
            fVar64 = (float)((uint)(fVar139 * fVar65 + fVar90 * fVar130 + fVar154 * fVar149) ^
                            uVar56);
            fVar80 = ABS(fVar122);
            fVar117 = ABS(fVar124);
            auVar98._0_8_ = CONCAT44(fVar124,fVar122) & 0x7fffffff7fffffff;
            auVar98._8_4_ = ABS(fVar125);
            auVar98._12_4_ = ABS(fVar126);
            auVar85._0_4_ =
                 -(uint)(auVar107._0_4_ + fVar133 <= fVar80) &
                 -(uint)((0.0 <= fVar133 && 0.0 <= auVar107._0_4_) && fVar122 != 0.0) & local_fa8;
            auVar85._4_4_ =
                 -(uint)(auVar107._4_4_ + fVar58 <= fVar117) &
                 -(uint)((0.0 <= fVar58 && 0.0 <= auVar107._4_4_) && fVar124 != 0.0) & uStack_fa4;
            auVar85._8_4_ =
                 -(uint)(auVar107._8_4_ + fVar63 <= auVar98._8_4_) &
                 -(uint)((0.0 <= fVar63 && 0.0 <= auVar107._8_4_) && fVar125 != 0.0) & uStack_fa0;
            auVar85._12_4_ =
                 -(uint)(auVar107._12_4_ + fVar64 <= auVar98._12_4_) &
                 -(uint)((0.0 <= fVar64 && 0.0 <= auVar107._12_4_) && fVar126 != 0.0) & uStack_f9c;
            iVar38 = movmskps((int)lVar41,auVar85);
            _fStack_11c0 = uVar37;
            if (iVar38 != 0) {
              fVar126 = (float)(uVar53 ^ (uint)(fVar67 * fVar110 +
                                               fVar131 * fVar66 + fVar79 * fVar142));
              fVar57 = (float)(uVar54 ^ (uint)(fVar71 * fVar114 +
                                              fVar134 * fVar57 + fVar87 * fVar145));
              fVar79 = (float)(uVar55 ^ (uint)(fVar146 * fVar115 +
                                              fVar136 * fVar72 + fStack_1200 * fVar148));
              fVar87 = (float)(uVar56 ^ (uint)(fVar73 * fVar116 +
                                              fVar138 * fVar74 + fStack_11fc * fVar150));
              fVar66 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar123._0_4_ = (ray->super_RayK<1>).tfar;
              auVar123._4_4_ = (ray->super_RayK<1>).mask;
              auVar123._8_4_ = (ray->super_RayK<1>).id;
              auVar123._12_4_ = (ray->super_RayK<1>).flags;
              auVar78._0_4_ =
                   -(uint)(fVar126 <= (float)auVar123._0_4_ * fVar80 && fVar66 * fVar80 < fVar126) &
                   auVar85._0_4_;
              auVar78._4_4_ =
                   -(uint)(fVar57 <= (float)auVar123._0_4_ * fVar117 && fVar66 * fVar117 < fVar57) &
                   auVar85._4_4_;
              auVar78._8_4_ =
                   -(uint)(fVar79 <= (float)auVar123._0_4_ * auVar98._8_4_ &&
                          fVar66 * auVar98._8_4_ < fVar79) & auVar85._8_4_;
              auVar78._12_4_ =
                   -(uint)(fVar87 <= (float)auVar123._0_4_ * auVar98._12_4_ &&
                          fVar66 * auVar98._12_4_ < fVar87) & auVar85._12_4_;
              iVar38 = movmskps(iVar38,auVar78);
              if (iVar38 != 0) {
                local_10d8 = auVar107;
                local_10c8 = fVar133;
                fStack_10c4 = fVar58;
                fStack_10c0 = fVar63;
                fStack_10bc = fVar64;
                local_10b8 = fVar126;
                fStack_10b4 = fVar57;
                fStack_10b0 = fVar79;
                fStack_10ac = fVar87;
                local_10a8 = auVar98;
                local_1088 = auVar78;
                auVar32._8_4_ = fVar115;
                auVar32._12_4_ = fVar116;
                local_1048 = auVar32;
                local_1038 = auVar59;
                local_1028[0] = fVar142;
                local_1028[1] = fVar145;
                local_1028[2] = fVar148;
                local_1028[3] = fVar150;
                local_11b8 = auVar78;
                auVar81 = rcpps(auVar59,auVar98);
                fVar66 = auVar81._0_4_;
                fVar65 = auVar81._4_4_;
                fVar67 = auVar81._8_4_;
                fVar71 = auVar81._12_4_;
                fVar66 = (1.0 - fVar80 * fVar66) * fVar66 + fVar66;
                fVar65 = (1.0 - fVar117 * fVar65) * fVar65 + fVar65;
                fVar67 = (1.0 - auVar98._8_4_ * fVar67) * fVar67 + fVar67;
                fVar71 = (1.0 - auVar98._12_4_ * fVar71) * fVar71 + fVar71;
                fVar126 = fVar126 * fVar66;
                fVar57 = fVar57 * fVar65;
                fVar79 = fVar79 * fVar67;
                fVar87 = fVar87 * fVar71;
                local_1058[0] = fVar126;
                local_1058[1] = fVar57;
                local_1058[2] = fVar79;
                local_1058[3] = fVar87;
                local_1078._0_4_ = auVar107._0_4_ * fVar66;
                local_1078._4_4_ = auVar107._4_4_ * fVar65;
                local_1078._8_4_ = auVar107._8_4_ * fVar67;
                local_1078._12_4_ = auVar107._12_4_ * fVar71;
                local_1068[0] = fVar66 * fVar133;
                local_1068[1] = fVar65 * fVar58;
                local_1068[2] = fVar67 * fVar63;
                local_1068[3] = fVar71 * fVar64;
                auVar60._0_4_ = auVar78._0_4_ & (uint)fVar126;
                auVar60._4_4_ = auVar78._4_4_ & (uint)fVar57;
                auVar60._8_4_ = auVar78._8_4_ & (uint)fVar79;
                auVar60._12_4_ = auVar78._12_4_ & (uint)fVar87;
                auVar99._0_8_ = CONCAT44(~auVar78._4_4_,~auVar78._0_4_) & 0x7f8000007f800000;
                auVar99._8_4_ = ~auVar78._8_4_ & 0x7f800000;
                auVar99._12_4_ = ~auVar78._12_4_ & 0x7f800000;
                auVar99 = auVar99 | auVar60;
                auVar86._4_4_ = auVar99._0_4_;
                auVar86._0_4_ = auVar99._4_4_;
                auVar86._8_4_ = auVar99._12_4_;
                auVar86._12_4_ = auVar99._8_4_;
                auVar81 = minps(auVar86,auVar99);
                auVar61._0_8_ = auVar81._8_8_;
                auVar61._8_4_ = auVar81._0_4_;
                auVar61._12_4_ = auVar81._4_4_;
                auVar81 = minps(auVar61,auVar81);
                auVar62._0_8_ =
                     CONCAT44(-(uint)(auVar81._4_4_ == auVar99._4_4_) & auVar78._4_4_,
                              -(uint)(auVar81._0_4_ == auVar99._0_4_) & auVar78._0_4_);
                auVar62._8_4_ = -(uint)(auVar81._8_4_ == auVar99._8_4_) & auVar78._8_4_;
                auVar62._12_4_ = -(uint)(auVar81._12_4_ == auVar99._12_4_) & auVar78._12_4_;
                iVar38 = movmskps(iVar38,auVar62);
                if (iVar38 != 0) {
                  auVar78._8_4_ = auVar62._8_4_;
                  auVar78._0_8_ = auVar62._0_8_;
                  auVar78._12_4_ = auVar62._12_4_;
                }
                uVar39 = movmskps(iVar38,auVar78);
                uVar42 = CONCAT44((int)((ulong)lVar41 >> 0x20),uVar39);
                context = (RayQueryContext *)0x0;
                uVar53 = auVar123._4_4_;
                if (uVar42 != 0) {
                  for (; (uVar42 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                do {
                  uVar54 = *(uint *)((long)&local_f88 + (long)context * 4);
                  pRVar43 = (RayQueryContext *)(ulong)uVar54;
                  pGVar25 = (local_1198->geometries).items[(long)pRVar43].ptr;
                  if ((pGVar25->mask & uVar53) == 0) {
                    *(undefined4 *)(local_11b8 + (long)context * 4) = 0;
                  }
                  else {
                    pRVar27 = local_11a0->args;
                    if (pRVar27->filter == (RTCFilterFunctionN)0x0) {
                      pRVar45 = local_11a0->user;
                      if (pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar66 = *(float *)(local_1078 + (long)context * 4);
                        fVar57 = local_1068[(long)context];
                        (ray->super_RayK<1>).tfar = local_1058[(long)context];
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1048 + (long)context * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1038 + (long)context * 4);
                        (ray->Ng).field_0.field_0.z = local_1028[(long)context];
                        ray->u = fVar66;
                        ray->v = fVar57;
                        uVar53 = *(uint *)((long)&local_10e8 + (long)context * 4);
                        context = (RayQueryContext *)(ulong)uVar53;
                        ray->primID = uVar53;
                        ray->geomID = uVar54;
                        ray->instID[0] = pRVar45->instID[0];
                        ray->instPrimID[0] = pRVar45->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar45 = local_11a0->user;
                    }
                    local_1118 = *(float *)(local_1048 + (long)context * 4);
                    local_1114 = *(undefined4 *)(local_1038 + (long)context * 4);
                    local_1110 = local_1028[(long)context];
                    local_110c = *(undefined4 *)(local_1078 + (long)context * 4);
                    local_1108 = local_1068[(long)context];
                    local_1104 = *(undefined4 *)((long)&local_10e8 + (long)context * 4);
                    local_1100 = uVar54;
                    local_10fc = pRVar45->instID[0];
                    local_10f8 = pRVar45->instPrimID[0];
                    local_11c8 = context;
                    (ray->super_RayK<1>).tfar = local_1058[(long)context];
                    local_11cc = (undefined1  [4])0xffffffff;
                    local_1188.valid = (int *)local_11cc;
                    local_1188.geometryUserPtr = pGVar25->userPtr;
                    local_1188.context = pRVar45;
                    local_1188.ray = (RTCRayN *)ray;
                    local_1188.hit = (RTCHitN *)&local_1118;
                    local_1188.N = 1;
                    if (((pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar25->intersectionFilterN)(&local_1188), context = extraout_RDX,
                        *(int *)(Scene **)local_1188.valid != 0)) &&
                       ((pRVar27->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar27->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((pGVar25->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar27->filter)(&local_1188), context = extraout_RDX_00,
                         *(int *)(Scene **)local_1188.valid != 0)))))) {
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1188.hit;
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1188.hit + 4);
                      (((Vec3f *)((long)local_1188.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1188.hit + 8);
                      *(float *)((long)local_1188.ray + 0x3c) = *(float *)(local_1188.hit + 0xc);
                      *(float *)((long)local_1188.ray + 0x40) = *(float *)(local_1188.hit + 0x10);
                      *(float *)((long)local_1188.ray + 0x44) = *(float *)(local_1188.hit + 0x14);
                      *(float *)((long)local_1188.ray + 0x48) = *(float *)(local_1188.hit + 0x18);
                      context = (RayQueryContext *)(ulong)(uint)*(float *)(local_1188.hit + 0x1c);
                      *(float *)((long)local_1188.ray + 0x4c) = *(float *)(local_1188.hit + 0x1c);
                      *(float *)((long)local_1188.ray + 0x50) = *(float *)(local_1188.hit + 0x20);
                    }
                    else {
                      local_11f8 = auVar123._0_4_;
                      (ray->super_RayK<1>).tfar = local_11f8;
                    }
                    *(undefined4 *)(local_11b8 + (long)local_11c8 * 4) = 0;
                    auVar123._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar123._4_4_ = (ray->super_RayK<1>).mask;
                    auVar123._8_4_ = (ray->super_RayK<1>).id;
                    auVar123._12_4_ = (ray->super_RayK<1>).flags;
                    local_11b8._0_4_ = -(uint)(fVar126 <= (float)auVar123._0_4_) & local_11b8._0_4_;
                    local_11b8._4_4_ = -(uint)(fVar57 <= (float)auVar123._0_4_) & local_11b8._4_4_;
                    local_11b8._8_4_ = -(uint)(fVar79 <= (float)auVar123._0_4_) & local_11b8._8_4_;
                    local_11b8._12_4_ = -(uint)(fVar87 <= (float)auVar123._0_4_) & local_11b8._12_4_
                    ;
                    uVar53 = (ray->super_RayK<1>).mask;
                    pRVar43 = local_11c8;
                    fStack_1200 = fVar79;
                    fStack_11fc = fVar87;
                  }
                  iVar38 = movmskps((int)pRVar43,local_11b8);
                  if (iVar38 == 0) break;
                  BVHNIntersector1<4,16777232,false,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiMBIntersector1Moeller<4,true>>>
                  ::intersect();
                  context = (RayQueryContext *)local_1188.valid;
                  fStack_1200 = fVar79;
                  fStack_11fc = fVar87;
                } while( true );
              }
            }
            local_1190 = local_1190 + 1;
          } while (local_1190 != local_1150);
        }
        fVar117 = (ray->super_RayK<1>).tfar;
        auVar81._4_4_ = fVar117;
        auVar81._0_4_ = fVar117;
        auVar81._8_4_ = fVar117;
        auVar81._12_4_ = fVar117;
        uVar42 = local_1158;
        fVar126 = local_fb8;
        fVar133 = fStack_fb4;
        fVar58 = fStack_fb0;
        fVar80 = fStack_fac;
        fVar79 = local_fc8;
        fVar87 = fStack_fc4;
        fVar64 = fStack_fc0;
        fVar63 = fStack_fbc;
        fVar65 = local_fd8;
        fVar67 = fStack_fd4;
        fVar71 = fStack_fd0;
        fVar146 = fStack_fcc;
        fVar72 = local_fe8;
        fVar73 = fStack_fe4;
        fVar74 = fStack_fe0;
        fVar66 = fStack_fdc;
        fVar88 = local_ff8;
        fVar89 = fStack_ff4;
        fVar90 = fStack_ff0;
        fVar57 = fStack_fec;
        fVar91 = local_1008;
        fVar100 = fStack_1004;
        fVar101 = fStack_1000;
        fVar140 = fStack_ffc;
        fVar102 = local_1018;
        fVar108 = fStack_1014;
        fVar109 = fStack_1010;
        fVar143 = fStack_100c;
      }
    } while (pauVar40 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }